

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
::Remove(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
         *this,PropertyRecord **key)

{
  uint uVar1;
  int iVar2;
  Type piVar3;
  uint uVar4;
  Type pSVar5;
  ulong uVar6;
  ulong uVar7;
  uint depth;
  uint uVar8;
  
  piVar3 = this->buckets;
  depth = 0;
  if (piVar3 != (Type)0x0) {
    uVar4 = GetBucket((*key)->hash * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar1 = piVar3[uVar4];
    uVar7 = (ulong)(int)uVar1;
    depth = 0;
    if (-1 < (long)uVar7) {
      pSVar5 = this->entries;
      if (pSVar5[uVar7].
          super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
          .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
          super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
          .super_ValueEntryData<const_Js::PropertyRecord_*>.value == *key) {
        depth = 0;
        uVar8 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar8 = uVar1;
          depth = depth + 1;
          uVar1 = pSVar5[uVar8].
                  super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  .
                  super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>
                  .
                  super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
                  .super_ValueEntryData<const_Js::PropertyRecord_*>.next;
          uVar7 = (ulong)(int)uVar1;
          if ((long)uVar7 < 0) goto LAB_007c0467;
        } while (pSVar5[uVar7].
                 super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 .
                 super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>
                 .
                 super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
                 .super_ValueEntryData<const_Js::PropertyRecord_*>.value != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar5 = this->entries;
      }
      uVar6 = uVar7 & 0xffffffff;
      iVar2 = pSVar5[uVar6].
              super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
              super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
              .super_ValueEntryData<const_Js::PropertyRecord_*>.next;
      if ((int)uVar8 < 0) {
        this->buckets[uVar4] = iVar2;
      }
      else {
        pSVar5[uVar8].
        super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
        .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
        super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
        .super_ValueEntryData<const_Js::PropertyRecord_*>.next = iVar2;
      }
      pSVar5[uVar6].
      super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
      super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
      .super_ValueEntryData<const_Js::PropertyRecord_*>.value = (PropertyRecord *)0x0;
      SetNextFreeEntryIndex
                (this,this->entries + uVar6,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar7;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,this->buckets[uVar4] == -1);
      return true;
    }
  }
LAB_007c0467:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }